

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void getBytes(istream *stream,size_t count,string *out)

{
  if (count != 0) {
    do {
      if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) != 0) {
        return;
      }
      std::istream::get();
      std::__cxx11::string::push_back((char)out);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void getBytes( istream& stream, const size_t count, string& out ){
    for( size_t i = 0; i < count && stream.good(); ++i ){
        out += (char)stream.get();
    }
}